

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

ly_ctx * ly_ctx_new_yl_common
                   (char *search_dir,char *input,LYD_FORMAT format,
                   _func_lyd_node_ptr_ly_ctx_ptr_char_ptr_LYD_FORMAT_int_varargs *parser_func)

{
  lyd_node *plVar1;
  lyd_node *node;
  char *__s1;
  int iVar2;
  ly_ctx *ctx;
  lyd_node *node_00;
  lys_module *module;
  LY_ERR *pLVar3;
  lyd_node *name;
  lyd_node **pplVar4;
  ulong uVar5;
  undefined1 auStack_58 [8];
  ly_set features;
  
  auStack_58 = (undefined1  [8])0x0;
  features.size = 0;
  features.number = 0;
  ctx = ly_ctx_new(search_dir);
  if (ctx == (ly_ctx *)0x0) {
    plVar1 = (lyd_node *)0x0;
  }
  else {
    node_00 = (*parser_func)(ctx,input,format,0,0);
    plVar1 = (lyd_node *)0x0;
    if (node_00 != (lyd_node *)0x0) {
      pplVar4 = &node_00->child;
      while (plVar1 = *pplVar4, plVar1 != (lyd_node *)0x0) {
        if (plVar1->schema->nodetype != LYS_LEAF) {
          ly_set_clean((ly_set *)auStack_58);
          name = (lyd_node *)0x0;
          features.set.s = (lys_node **)0x0;
          pplVar4 = &plVar1->child;
          while (node = *pplVar4, node != (lyd_node *)0x0) {
            __s1 = node->schema->name;
            iVar2 = strcmp(__s1,"name");
            if (iVar2 == 0) {
              name = node->child;
            }
            else {
              iVar2 = strcmp(__s1,"revision");
              if (iVar2 == 0) {
                features.set = (ly_set_set)node->child;
              }
              else {
                iVar2 = strcmp(__s1,"feature");
                if (iVar2 == 0) {
                  ly_set_add((ly_set *)auStack_58,node,1);
                }
                else {
                  iVar2 = strcmp(__s1,"conformance-type");
                  if ((iVar2 == 0) && (*(int *)(node[1].schema)->padding != 0)) goto LAB_0010f804;
                }
              }
            }
            pplVar4 = &node->next;
          }
          module = ly_ctx_load_module(ctx,(char *)name,(char *)features.set.s);
          if (module == (lys_module *)0x0) {
            pLVar3 = ly_errno_location();
            *pLVar3 = LY_EINVAL;
            ly_log(LY_LLERR,"Unable to load module specified by yang library data.");
            plVar1 = node_00;
            goto LAB_0010f920;
          }
          for (uVar5 = 0; uVar5 < (ulong)auStack_58 >> 0x20; uVar5 = uVar5 + 1) {
            lys_features_enable(module,*(char **)(*(long *)(features._0_8_ + uVar5 * 8) + 0x30));
          }
        }
LAB_0010f804:
        pplVar4 = &plVar1->next;
      }
      goto LAB_0010f930;
    }
  }
LAB_0010f920:
  node_00 = plVar1;
  ly_ctx_destroy(ctx,(_func_void_lys_node_ptr_void_ptr *)0x0);
  ctx = (ly_ctx *)0x0;
LAB_0010f930:
  if (node_00 != (lyd_node *)0x0) {
    lyd_free_withsiblings(node_00);
  }
  return ctx;
}

Assistant:

static struct ly_ctx *
ly_ctx_new_yl_common(const char *search_dir, const char *input, LYD_FORMAT format,
                     struct lyd_node* (*parser_func)(struct ly_ctx*, const char*, LYD_FORMAT, int,...))
{
    unsigned int u;
    struct lyd_node *module, *node;
    const char *name, *revision;
    struct ly_set features = {0, 0, {NULL}};
    const struct lys_module *mod;
    struct lyd_node *yltree = NULL;
    struct ly_ctx *ctx = NULL;

    /* create empty (with internal modules including ietf-yang-library) context */
    ctx = ly_ctx_new(search_dir);
    if (!ctx) {
        goto error;
    }

    /* parse yang library data tree */
    yltree = parser_func(ctx, input, format, LYD_OPT_DATA, NULL);
    if (!yltree) {
        goto error;
    }

    /* process the data tree */
    LY_TREE_FOR(yltree->child, module) {
        if (module->schema->nodetype == LYS_LEAF) {
            /* module-set-id - ignore it */
            continue;
        }

        /* initiate */
        name = NULL;
        revision = NULL;
        ly_set_clean(&features);

        LY_TREE_FOR(module->child, node) {
            if (!strcmp(node->schema->name, "name")) {
                name = ((struct lyd_node_leaf_list*)node)->value_str;
            } else if (!strcmp(node->schema->name, "revision")) {
                revision = ((struct lyd_node_leaf_list*)node)->value_str;
            } else if (!strcmp(node->schema->name, "feature")) {
                ly_set_add(&features, node, LY_SET_OPT_USEASLIST);
            } else if (!strcmp(node->schema->name, "conformance-type") &&
                    ((struct lyd_node_leaf_list*)node)->value.enm->value) {
                /* imported module - skip it, it will be loaded as a side effect
                 * of loading another module */
                goto next_module;
            }
        }

        /* use the gathered data to load the module */
        mod = ly_ctx_load_module(ctx, name, revision);
        if (!mod) {
            LOGERR(LY_EINVAL, "Unable to load module specified by yang library data.");
            goto error;
        }

        /* set features */
        for (u = 0; u < features.number; u++) {
            lys_features_enable(mod, ((struct lyd_node_leaf_list*)features.set.d[u])->value_str);
        }

next_module:;
    }

    if (0) {
        /* skip context destroy in case of success */
error:
        ly_ctx_destroy(ctx, NULL);
        ctx = NULL;
    }

    /* cleanup */
    if (yltree) {
        /* yang library data tree */
        lyd_free_withsiblings(yltree);
    }

    return ctx;
}